

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O1

void __thiscall KVStore::compaction(KVStore *this,int level)

{
  _WordT *p_Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  *ppVar2;
  undefined8 *puVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *pmVar4;
  ulong uVar5;
  size_type sVar6;
  mapped_type pSVar7;
  pointer ppVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *pmVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  pointer pbVar15;
  pointer ppVar16;
  pointer ppVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  undefined8 *puVar21;
  mapped_type *ppSVar22;
  long *plVar23;
  SSTableCache *pSVar24;
  const_iterator cVar25;
  uint uVar26;
  pointer *pppVar27;
  string *psVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  pointer pbVar33;
  long lVar34;
  pointer pcVar35;
  long lVar36;
  __mode_t __mode;
  undefined8 uVar37;
  _Alloc_hider _Var38;
  ulong uVar39;
  pointer ppVar40;
  pointer ppVar41;
  ulong uVar42;
  pointer ppVar43;
  _Alloc_hider _Var44;
  long lVar45;
  pointer pcVar46;
  value_type *pvVar47;
  uint uVar48;
  uint uVar49;
  key_type *pkVar50;
  long lVar51;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar52;
  pointer ppVar53;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  pVar54;
  priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_markcty[P]LSM_KV_kvstore_cpp:130:16)>
  q;
  value_type top;
  stat st;
  string nextDir;
  string __str_5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compactionFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirFiles;
  SSTableDic t;
  string dir;
  SSTableDic mergedDic;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  dics;
  undefined1 local_370 [32];
  KVStore *local_350;
  string *local_348;
  uint local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [56];
  undefined1 local_2f0 [16];
  string local_2e0 [4];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  local_260;
  key_type *local_220;
  pointer *local_218;
  _WordT local_210;
  pointer local_208 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  SSTableDic local_1b8;
  _WordT *local_1a0;
  _WordT local_198;
  _WordT local_190;
  _WordT _Stack_188;
  size_type local_180;
  key_type *local_178;
  uint local_16c;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  _WordT *local_148;
  _WordT local_140;
  _WordT local_138;
  _WordT _Stack_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_110;
  string local_f8;
  value_type *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  _WordT *local_70 [2];
  _WordT local_60 [2];
  _WordT *local_50 [2];
  _WordT local_40 [2];
  stat *__buf;
  
  local_2f0._0_8_ = local_2e0;
  pcVar35 = (this->storagePath)._M_dataplus._M_p;
  local_350 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,pcVar35,pcVar35 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)local_2f0);
  uVar31 = -level;
  if (0 < level) {
    uVar31 = level;
  }
  uVar48 = 1;
  if (9 < uVar31) {
    uVar29 = (ulong)uVar31;
    uVar49 = 4;
    do {
      uVar48 = uVar49;
      uVar32 = (uint)uVar29;
      if (uVar32 < 100) {
        uVar48 = uVar48 - 2;
        goto LAB_001048cc;
      }
      if (uVar32 < 1000) {
        uVar48 = uVar48 - 1;
        goto LAB_001048cc;
      }
      if (uVar32 < 10000) goto LAB_001048cc;
      uVar29 = uVar29 / 10000;
      uVar49 = uVar48 + 4;
    } while (99999 < uVar32);
    uVar48 = uVar48 + 1;
  }
LAB_001048cc:
  paVar52 = &local_260.first.field_2;
  local_328._48_8_ = (pointer)(ulong)(uint)level;
  local_260.first._M_dataplus._M_p = (pointer)paVar52;
  std::__cxx11::string::_M_construct((ulong)&local_260,(char)uVar48 - (char)(level >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_260.first._M_dataplus._M_p + ((uint)level >> 0x1f),uVar48,uVar31);
  pcVar35 = (pointer)((long)(unsigned_long *)local_2f0._8_8_ + local_260.first._M_string_length);
  _Var44._M_p = (pointer)0xf;
  if ((string *)local_2f0._0_8_ != local_2e0) {
    _Var44._M_p = local_2e0[0]._M_dataplus._M_p;
  }
  ppVar43 = (pointer)local_2f0._8_8_;
  if (_Var44._M_p < pcVar35) {
    uVar37 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.first._M_dataplus._M_p != paVar52) {
      uVar37 = local_260.first.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar37 < pcVar35) goto LAB_00104967;
    puVar21 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,local_2f0._0_8_);
  }
  else {
LAB_00104967:
    puVar21 = (undefined8 *)
              std::__cxx11::string::_M_append(local_2f0,(ulong)local_260.first._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  p_Var1 = puVar21 + 2;
  if ((_WordT *)*puVar21 == p_Var1) {
    local_190 = *p_Var1;
    _Stack_188 = puVar21[3];
  }
  else {
    local_190 = *p_Var1;
    local_1a0 = (_WordT *)*puVar21;
  }
  local_198 = puVar21[1];
  *puVar21 = p_Var1;
  puVar21[1] = 0;
  *(undefined1 *)p_Var1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.first._M_dataplus._M_p != paVar52) {
    operator_delete(local_260.first._M_dataplus._M_p,
                    (ulong)(local_260.first.field_2._M_allocated_capacity + 1));
  }
  if ((string *)local_2f0._0_8_ != local_2e0) {
    operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_1a0,(undefined1 *)(local_198 + (long)local_1a0));
  iVar18 = stat((char *)local_50[0],(stat *)local_2f0);
  uVar31 = (uint)(undefined4)local_2e0[0]._M_string_length >> 0xe;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (((byte)uVar31 & 1 & iVar18 == 0) == 0) goto LAB_00106231;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_33c = (int)local_328._48_8_ + 1;
  iVar18 = 1;
  uVar31 = local_33c;
  if (-1 < (int)local_328._48_8_) {
    do {
      iVar18 = iVar18 * 2;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_1a0,(undefined1 *)(local_198 + (long)local_1a0));
  iVar19 = utils::scanDir(&local_90,&local_1d8);
  local_220 = (key_type *)CONCAT44(local_220._4_4_,iVar19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pbVar15 = local_1d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar18 < (int)local_220) {
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar33 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2f0._0_8_ = local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f0,local_1a0,(undefined1 *)(local_198 + (long)local_1a0));
        std::__cxx11::string::_M_replace_aux((ulong)local_2f0,local_2f0._8_8_,0,'\x01');
        ppVar43 = (pointer)local_2f0._8_8_;
        std::__cxx11::string::replace((ulong)pbVar33,0,(char *)0x0,local_2f0._0_8_);
        if ((string *)local_2f0._0_8_ != local_2e0) {
          operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
        }
        pbVar33 = pbVar33 + 1;
      } while (pbVar33 != pbVar15);
    }
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_328._48_4_ == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_1f8,&local_1d8);
    }
    else {
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
      local_328._0_8_ = (pointer)0x0;
      local_338._8_8_ = (pointer)0x0;
      local_338._0_8_ = (SSTableCache *)0x0;
      local_370._16_8_ = (pointer)0x0;
      local_370._8_8_ = (pointer)0x0;
      local_370._0_8_ =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            *)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                 *)local_338);
      pbVar15 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_348 = (string *)&local_350->cache;
        pbVar33 = local_1d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          ppSVar22 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                     ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                           *)local_348,pbVar33);
          SSTableCache::getHeader(*ppSVar22);
          std::
          vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
          ::emplace_back<std::__cxx11::string_const&,SSTableHeader>
                    ((vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
                      *)local_370,pbVar33,(SSTableHeader *)local_338);
          uVar13 = local_370._8_8_;
          uVar37 = local_370._0_8_;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_2f0,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)(local_370._8_8_ + -0x40));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair(&local_260,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_2f0);
          std::
          __push_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_val<KVStore::compaction(int)::__0>>
                    ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>_>
                      )uVar37,((long)(uVar13 - uVar37) >> 6) + -1,0,&local_260,
                     (_Iter_comp_val<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_markcty[P]LSM_KV_kvstore_cpp:130:16)>
                      *)ppVar43);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260.first._M_dataplus._M_p != &local_260.first.field_2) {
            operator_delete(local_260.first._M_dataplus._M_p,
                            (ulong)(local_260.first.field_2._M_allocated_capacity + 1));
          }
          if ((string *)local_2f0._0_8_ != local_2e0) {
            operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
          }
          pbVar33 = pbVar33 + 1;
        } while (pbVar33 != pbVar15);
      }
      iVar18 = iVar18 - (int)local_220;
      if (iVar18 != 0) {
        do {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_338,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)local_370._0_8_);
          uVar13 = local_370._8_8_;
          uVar37 = local_370._0_8_;
          if (0x40 < (long)(local_370._8_8_ - local_370._0_8_)) {
            ppVar2 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                      *)(local_370._8_8_ + -0x40);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)local_2f0,ppVar2);
            std::__cxx11::string::operator=((string *)ppVar2,(string *)uVar37);
            uVar9 = ((SSTableHeader *)(uVar37 + 0x20))->length;
            uVar10 = ((SSTableHeader *)(uVar37 + 0x20))->minKey;
            uVar11 = ((SSTableHeader *)(uVar37 + 0x20))->maxKey;
            (((pointer)(uVar13 + -0x40))->second).timeStamp =
                 ((SSTableHeader *)(uVar37 + 0x20))->timeStamp;
            (((pointer)(uVar13 + -0x40))->second).length = uVar9;
            (((pointer)(uVar13 + -0x40))->second).minKey = uVar10;
            (((pointer)(uVar13 + -0x40))->second).maxKey = uVar11;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair(&local_260,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)local_2f0);
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_iter<KVStore::compaction(int)::__0>>
                      (uVar37,0,(long)ppVar2 - uVar37 >> 6,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260.first._M_dataplus._M_p != &local_260.first.field_2) {
              operator_delete(local_260.first._M_dataplus._M_p,
                              (ulong)(local_260.first.field_2._M_allocated_capacity + 1));
            }
            if ((string *)local_2f0._0_8_ != local_2e0) {
              operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
            }
          }
          ppVar40 = (pointer)(local_370._8_8_ + -0x40);
          pcVar35 = (((pointer)(local_370._8_8_ + -0x40))->first)._M_dataplus._M_p;
          paVar52 = &(((pointer)(local_370._8_8_ + -0x40))->first).field_2;
          local_370._8_8_ = ppVar40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar35 != paVar52) {
            operator_delete(pcVar35,paVar52->_M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1f8,(value_type *)local_338);
          if ((SSTableCache *)local_338._0_8_ != (SSTableCache *)local_328) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != 0);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                 *)local_370);
    }
    pbVar15 = local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var44._M_p = (pointer)0xffffffffffffffff;
      local_348 = (string *)0x0;
      pcVar35 = (pointer)0x0;
    }
    else {
      pmVar4 = &local_350->cache;
      pcVar35 = (pointer)0x0;
      local_348 = (string *)0x0;
      pbVar33 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar46 = (pointer)0xffffffffffffffff;
      do {
        ppSVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at(pmVar4,pbVar33);
        SSTableCache::getHeader(*ppSVar22);
        if (pcVar35 < local_2e0[0]._M_string_length) {
          pcVar35 = (pointer)local_2e0[0]._M_string_length;
        }
        _Var44._M_p = local_2e0[0]._M_dataplus._M_p;
        if (pcVar46 < local_2e0[0]._M_dataplus._M_p) {
          _Var44._M_p = pcVar46;
        }
        if (local_348 < (ulong)local_2f0._0_8_) {
          local_348 = (string *)local_2f0._0_8_;
        }
        pbVar33 = pbVar33 + 1;
        pcVar46 = _Var44._M_p;
      } while (pbVar33 != pbVar15);
    }
    local_2f0._0_8_ = local_2e0;
    pcVar46 = (local_350->storagePath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f0,pcVar46,pcVar46 + (local_350->storagePath)._M_string_length);
    std::__cxx11::string::append(local_2f0);
    uVar31 = -local_33c;
    if (0 < (int)local_33c) {
      uVar31 = local_33c;
    }
    uVar48 = 1;
    if (9 < uVar31) {
      uVar29 = (ulong)uVar31;
      uVar49 = 4;
      do {
        uVar48 = uVar49;
        uVar32 = (uint)uVar29;
        if (uVar32 < 100) {
          uVar48 = uVar48 - 2;
          goto LAB_001050b1;
        }
        if (uVar32 < 1000) {
          uVar48 = uVar48 - 1;
          goto LAB_001050b1;
        }
        if (uVar32 < 10000) goto LAB_001050b1;
        uVar29 = uVar29 / 10000;
        uVar49 = uVar48 + 4;
      } while (99999 < uVar32);
      uVar48 = uVar48 + 1;
    }
LAB_001050b1:
    uVar49 = local_33c >> 0x1f;
    local_338._0_8_ = local_328;
    std::__cxx11::string::_M_construct
              ((ulong)local_338,(char)uVar48 - (char)((int)local_33c >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_338._0_8_ + (ulong)uVar49),uVar48,uVar31);
    ppVar40 = (pointer)((long)(unsigned_long *)local_2f0._8_8_ +
                       (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_338._8_8_);
    _Var38._M_p = (pointer)(pointer)0xf;
    if ((string *)local_2f0._0_8_ != local_2e0) {
      _Var38._M_p = local_2e0[0]._M_dataplus._M_p;
    }
    if (_Var38._M_p < ppVar40) {
      ppVar41 = (pointer)0xf;
      if ((pointer)local_338._0_8_ != (pointer)local_328) {
        ppVar41 = (pointer)local_328._0_8_;
      }
      if (ppVar41 < ppVar40) goto LAB_0010513d;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_338,0,(char *)0x0,local_2f0._0_8_);
    }
    else {
LAB_0010513d:
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_2f0,local_338._0_8_);
    }
    local_260.first._M_dataplus._M_p = (pointer)&local_260.first.field_2;
    puVar3 = puVar21 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar21 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3) {
      local_260.first.field_2._M_allocated_capacity = *puVar3;
      local_260.first.field_2._8_8_ = puVar21[3];
    }
    else {
      local_260.first.field_2._M_allocated_capacity = *puVar3;
      local_260.first._M_dataplus._M_p = (pointer)*puVar21;
    }
    local_260.first._M_string_length = puVar21[1];
    *puVar21 = puVar3;
    puVar21[1] = 0;
    *(undefined1 *)puVar3 = 0;
    if ((pointer)local_338._0_8_ != (pointer)local_328) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
    }
    if ((string *)local_2f0._0_8_ != local_2e0) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_260.first._M_dataplus._M_p,
               local_260.first._M_dataplus._M_p + local_260.first._M_string_length);
    __buf = (stat *)local_2f0;
    iVar18 = stat((char *)local_70[0],__buf);
    __mode = (__mode_t)__buf;
    uVar31 = (uint)(undefined4)local_2e0[0]._M_string_length >> 0xe;
    if (local_70[0] != local_60) {
      uVar29 = local_60[0] + 1;
      operator_delete(local_70[0],uVar29);
      __mode = (__mode_t)uVar29;
    }
    if (((byte)uVar31 & 1 & iVar18 == 0) == 0) {
      utils::mkdir(local_260.first._M_dataplus._M_p,__mode);
    }
    pbVar33 = local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar15 = local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar52 = &(local_1d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar23 = (long *)(((key_type *)(paVar52 + -1))->_M_dataplus)._M_p;
        if (paVar52 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar23) {
          operator_delete(plVar23,paVar52->_M_allocated_capacity + 1);
        }
        pkVar50 = (key_type *)(paVar52 + 1);
        paVar52 = paVar52 + 2;
      } while (pkVar50 != pbVar33);
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar15;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_260.first._M_dataplus._M_p,
               local_260.first._M_dataplus._M_p + local_260.first._M_string_length);
    utils::scanDir(&local_b0,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pbVar15 = local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar33 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2f0._0_8_ = local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f0,local_260.first._M_dataplus._M_p,
                   local_260.first._M_dataplus._M_p + local_260.first._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_2f0,local_2f0._8_8_,0,'\x01');
        std::__cxx11::string::replace((ulong)pbVar33,0,(char *)0x0,local_2f0._0_8_);
        if ((string *)local_2f0._0_8_ != local_2e0) {
          operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
        }
        pbVar33 = pbVar33 + 1;
      } while (pbVar33 != pbVar15);
    }
    pbVar15 = local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pmVar4 = &local_350->cache;
      pbVar33 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ppSVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at(pmVar4,pbVar33);
        SSTableCache::getHeader(*ppSVar22);
        if (((local_2e0[0]._M_dataplus._M_p <= pcVar35 &&
              _Var44._M_p <= local_2e0[0]._M_dataplus._M_p) ||
            (local_2e0[0]._M_string_length <= pcVar35 &&
             _Var44._M_p <= local_2e0[0]._M_string_length)) &&
           (std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_1f8,pbVar33), local_348 <= (ulong)local_2f0._0_8_)) {
          local_348 = (string *)local_2f0._0_8_;
        }
        pbVar33 = pbVar33 + 1;
      } while (pbVar33 != pbVar15);
    }
    local_220 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_178 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_338._0_8_ = local_328;
    pcVar35 = (local_350->storagePath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_338,pcVar35,pcVar35 + (local_350->storagePath)._M_string_length);
    std::__cxx11::string::append(local_338);
    uVar48 = (int)local_328._48_8_ + 2;
    uVar31 = -uVar48;
    if (0 < (int)uVar48) {
      uVar31 = uVar48;
    }
    uVar49 = 1;
    if (9 < uVar31) {
      uVar29 = (ulong)uVar31;
      uVar32 = 4;
      do {
        uVar49 = uVar32;
        uVar26 = (uint)uVar29;
        if (uVar26 < 100) {
          uVar49 = uVar49 - 2;
          goto LAB_00105536;
        }
        if (uVar26 < 1000) {
          uVar49 = uVar49 - 1;
          goto LAB_00105536;
        }
        if (uVar26 < 10000) goto LAB_00105536;
        uVar29 = uVar29 / 10000;
        uVar32 = uVar49 + 4;
      } while (99999 < uVar26);
      uVar49 = uVar49 + 1;
    }
LAB_00105536:
    local_370._0_8_ = local_370 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_370,(char)uVar49 - (char)((int)uVar48 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_370._0_8_)->_M_dataplus)._M_p + (ulong)(uVar48 >> 0x1f)),
               uVar49,uVar31);
    ppVar40 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_338._8_8_)->_M_dataplus)._M_p +
                       (long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_370._8_8_)->_M_dataplus)._M_p);
    ppVar41 = (pointer)0xf;
    if ((SSTableCache *)local_338._0_8_ != (SSTableCache *)local_328) {
      ppVar41 = (pointer)local_328._0_8_;
    }
    if (ppVar41 < ppVar40) {
      ppVar41 = (pointer)0xf;
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)local_370._0_8_ !=
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)(local_370 + 0x10)) {
        ppVar41 = (pointer)local_370._16_8_;
      }
      if (ppVar41 < ppVar40) goto LAB_001055b2;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_370,0,(char *)0x0,local_338._0_8_);
    }
    else {
LAB_001055b2:
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_338,local_370._0_8_);
    }
    local_148 = &local_138;
    p_Var1 = puVar21 + 2;
    if ((_WordT *)*puVar21 == p_Var1) {
      local_138 = *p_Var1;
      _Stack_130 = puVar21[3];
    }
    else {
      local_138 = *p_Var1;
      local_148 = (_WordT *)*puVar21;
    }
    local_140 = puVar21[1];
    *puVar21 = p_Var1;
    puVar21[1] = 0;
    *(undefined1 *)p_Var1 = 0;
    iVar18 = stat((char *)local_148,(stat *)local_2f0);
    uVar14 = (undefined4)local_2e0[0]._M_string_length;
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
         *)local_370._0_8_ !=
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
         *)(local_370 + 0x10)) {
      operator_delete((void *)local_370._0_8_,
                      (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_370._16_8_)->_M_dataplus)._M_p + 1));
    }
    if ((SSTableCache *)local_338._0_8_ != (SSTableCache *)local_328) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
    }
    std::
    vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::vector(&local_110,
             (long)local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_2f0);
    local_16c = uVar14;
    local_180 = (long)local_178 - (long)local_220 >> 5;
    if (local_178 == local_220) {
      lVar45 = 0;
    }
    else {
      lVar34 = local_180 + (local_180 == 0);
      lVar51 = 0;
      lVar36 = 0;
      lVar45 = 0;
      do {
        SSTable::readDic((string *)
                         ((long)&((local_1f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar36),(SSTableDic *)
                                 ((long)&((local_110.
                                           super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar51));
        unlink(*(char **)((long)&((local_1f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar36));
        lVar45 = lVar45 + (*(long *)((long)&((local_110.
                                              super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish + lVar51) -
                           *(long *)((long)&((local_110.
                                              super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar51) >>
                          3) * -0x3333333333333333;
        lVar36 = lVar36 + 0x20;
        lVar51 = lVar51 + 0x18;
        lVar34 = lVar34 + -1;
      } while (lVar34 != 0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_128,local_180,(allocator_type *)local_2f0);
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_168.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (lVar45 != 0) {
      uVar29 = local_180 + (local_180 == 0);
      local_328._48_8_ = &local_350->cache;
      psVar28 = (string *)0x0;
      do {
        if (local_178 == local_220) {
          lVar34 = 0;
        }
        else {
          pppVar27 = &((local_110.
                        super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          uVar39 = 0xffffffffffffffff;
          uVar30 = 0;
          uVar42 = 0;
          do {
            if ((local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar42] <
                 (ulong)(((long)*pppVar27 - (long)((_Vector_impl_data *)(pppVar27 + -1))->_M_start
                         >> 3) * -0x3333333333333333)) &&
               (uVar5 = ((_Vector_impl_data *)(pppVar27 + -1))->_M_start
                        [local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar42]].first, uVar5 < uVar39))
            {
              uVar30 = uVar42 & 0xffffffff;
              uVar39 = uVar5;
            }
            uVar42 = uVar42 + 1;
            pppVar27 = pppVar27 + 3;
          } while (uVar29 != uVar42);
          lVar34 = (long)(int)uVar30;
        }
        uVar39 = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar34];
        local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar34] = uVar39 + 1;
        ppVar43 = local_110.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar34].
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar30 = ((long)local_110.
                        super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar34].
                        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar43 >> 3) *
                 -0x3333333333333333;
        if (uVar30 < uVar39 || uVar30 - uVar39 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar39);
          goto LAB_00106275;
        }
        ppSVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                         *)local_328._48_8_,
                        local_1f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar34);
        SSTableCache::getHeader(*ppSVar22);
        ppVar43 = ppVar43 + uVar39;
        if ((local_168.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_168.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (ppVar43->first !=
            local_168.
            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].first)) {
LAB_001058f7:
          std::
          vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
          ::emplace_back<unsigned_long_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
                      *)&local_168,&ppVar43->first,&ppVar43->second);
          psVar28 = (string *)local_2f0._0_8_;
        }
        else if (psVar28 <= (ulong)local_2f0._0_8_) {
          pvVar47 = local_168.
                    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          pcVar35 = local_168.
                    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second._M_dataplus._M_p;
          paVar52 = &local_168.
                     super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].second.field_2;
          local_168.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar47;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar35 != paVar52) {
            operator_delete(pcVar35,paVar52->_M_allocated_capacity + 1);
          }
          goto LAB_001058f7;
        }
        lVar45 = lVar45 + -1;
      } while (lVar45 != 0);
    }
    local_1b8.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_168.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar31 = local_16c >> 0xe;
      local_328._48_8_ = &local_350->cache;
      lVar45 = 0;
      lVar34 = 0;
      local_d8 = local_168.
                 super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppVar43 = local_168.
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar47 = local_168.
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (((iVar18 == 0 & (byte)uVar31 & 1) != 0) ||
           (iVar19 = std::__cxx11::string::compare((char *)&ppVar43->second), iVar19 != 0)) {
          if (0x1fffff < (ppVar43->second)._M_string_length + lVar34 + lVar45 * 0xc + 0x2838) {
            ppVar2 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                      *)(local_370 + 0x10);
            local_370._0_8_ = ppVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_370,local_260.first._M_dataplus._M_p,
                       local_260.first._M_dataplus._M_p + local_260.first._M_string_length);
            std::__cxx11::string::append((char *)local_370);
            uVar48 = local_350->fileNums;
            local_350->fileNums = uVar48 + 1;
            uVar49 = -uVar48;
            if (0 < (int)uVar48) {
              uVar49 = uVar48;
            }
            uVar32 = 1;
            if (9 < uVar49) {
              uVar29 = (ulong)uVar49;
              uVar26 = 4;
              do {
                uVar32 = uVar26;
                uVar20 = (uint)uVar29;
                if (uVar20 < 100) {
                  uVar32 = uVar32 - 2;
                  goto LAB_00105a61;
                }
                if (uVar20 < 1000) {
                  uVar32 = uVar32 - 1;
                  goto LAB_00105a61;
                }
                if (uVar20 < 10000) goto LAB_00105a61;
                uVar29 = uVar29 / 10000;
                uVar26 = uVar32 + 4;
              } while (99999 < uVar20);
              uVar32 = uVar32 + 1;
            }
LAB_00105a61:
            local_218 = local_208;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_218,(char)uVar32 - (char)((int)uVar48 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar48 >> 0x1f) + (long)local_218),uVar32,uVar49);
            ppVar40 = (pointer)0xf;
            if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                 *)local_370._0_8_ != ppVar2) {
              ppVar40 = (pointer)local_370._16_8_;
            }
            ppVar41 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_370._8_8_)->_M_dataplus)._M_p + local_210);
            if (ppVar40 < ppVar41) {
              ppVar40 = (pointer)0xf;
              if (local_218 != local_208) {
                ppVar40 = local_208[0];
              }
              if (ppVar40 < ppVar41) goto LAB_00105afa;
              plVar23 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_218,0,(char *)0x0,local_370._0_8_);
            }
            else {
LAB_00105afa:
              plVar23 = (long *)std::__cxx11::string::_M_append(local_370,(ulong)local_218);
            }
            local_338._0_8_ = local_328;
            ppVar40 = (pointer)(plVar23 + 2);
            if ((pointer)*plVar23 == ppVar40) {
              local_328._0_8_ = (ppVar40->first)._M_dataplus._M_p;
              local_328._8_8_ = plVar23[3];
            }
            else {
              local_328._0_8_ = (ppVar40->first)._M_dataplus._M_p;
              local_338._0_8_ = (pointer)*plVar23;
            }
            local_338._8_8_ = plVar23[1];
            *plVar23 = (long)ppVar40;
            plVar23[1] = 0;
            *(undefined1 *)&(ppVar40->first)._M_dataplus._M_p = 0;
            plVar23 = (long *)std::__cxx11::string::append(local_338);
            local_2f0._0_8_ = local_2e0;
            psVar28 = (string *)(plVar23 + 2);
            if ((string *)*plVar23 == psVar28) {
              local_2e0[0]._M_dataplus._M_p = (psVar28->_M_dataplus)._M_p;
              local_2e0[0]._M_string_length = plVar23[3];
            }
            else {
              local_2e0[0]._M_dataplus._M_p = (psVar28->_M_dataplus)._M_p;
              local_2f0._0_8_ = (string *)*plVar23;
            }
            local_2f0._8_8_ = plVar23[1];
            *plVar23 = (long)psVar28;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            if ((pointer)local_338._0_8_ != (pointer)local_328) {
              operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
            }
            if (local_218 != local_208) {
              operator_delete(local_218,(ulong)((long)&(local_208[0]->first)._M_dataplus._M_p + 1));
            }
            if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                 *)local_370._0_8_ != ppVar2) {
              operator_delete((void *)local_370._0_8_,
                              (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_370._16_8_)->_M_dataplus)._M_p + 1));
            }
            SSTable::toSSTable((SSTable *)&local_1b8,(SSTableDic *)local_2f0,local_348,
                               (uint64_t)psVar28);
            pSVar24 = (SSTableCache *)operator_new(0x2858);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,local_2f0._0_8_,
                       (pointer)(local_2f0._0_8_ + (long)(unsigned_long *)local_2f0._8_8_));
            SSTableCache::SSTableCache(pSVar24,&local_1b8,(uint64_t)local_348,&local_f8);
            local_338._0_8_ = pSVar24;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
            ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                        *)local_328._48_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f0,(SSTableCache **)local_338);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            pvVar47 = local_d8;
            ppVar17 = local_1b8.
                      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar16 = local_1b8.
                      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_1b8.
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_1b8.
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar52 = &((local_1b8.
                           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second).field_2;
              do {
                plVar23 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(paVar52 + -1))->_M_dataplus)._M_p;
                if (paVar52 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar23) {
                  operator_delete(plVar23,paVar52->_M_allocated_capacity + 1);
                }
                ppVar53 = (pointer)(paVar52 + 1);
                paVar52 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar52 + 0x28);
              } while (ppVar53 != ppVar17);
              local_1b8.
              super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar16;
            }
            if ((string *)local_2f0._0_8_ != local_2e0) {
              operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
            }
            lVar34 = 0;
            lVar45 = 0;
          }
          sVar6 = (ppVar43->second)._M_string_length;
          std::
          vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(&local_1b8,ppVar43);
          lVar34 = lVar34 + sVar6;
          lVar45 = lVar45 + 1;
        }
        ppVar43 = ppVar43 + 1;
      } while (ppVar43 != pvVar47);
    }
    if (local_178 != local_220) {
      pmVar4 = &local_350->cache;
      pmVar12 = &local_350->cache;
      lVar34 = local_180 + (local_180 == 0);
      lVar45 = 0;
      do {
        cVar25 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                 ::find(&pmVar4->_M_t,
                        (key_type *)
                        ((long)&((local_1f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar45));
        if ((_Rb_tree_header *)cVar25._M_node == &(pmVar12->_M_t)._M_impl.super__Rb_tree_header) {
LAB_00106275:
          __assert_fail("cache.count(compactionFiles[i])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/kvstore.cpp"
                        ,0xf4,"void KVStore::compaction(int)");
        }
        ppSVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                   ::at(pmVar4,(key_type *)
                               ((long)&((local_1f8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar45));
        pSVar7 = *ppSVar22;
        if (pSVar7 != (mapped_type)0x0) {
          pcVar35 = (pSVar7->fileName)._M_dataplus._M_p;
          paVar52 = &(pSVar7->fileName).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar35 != paVar52) {
            operator_delete(pcVar35,paVar52->_M_allocated_capacity + 1);
          }
          ppVar8 = (pSVar7->index).
                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (ppVar8 != (pointer)0x0) {
            operator_delete(ppVar8,(long)(pSVar7->index).
                                         super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)ppVar8);
          }
          operator_delete(pSVar7,0x2858);
        }
        pVar54 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                 ::equal_range(&pmVar4->_M_t,
                               (key_type *)
                               ((long)&((local_1f8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar45));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
        ::_M_erase_aux(&pmVar4->_M_t,(_Base_ptr)pVar54.first._M_node,
                       (_Base_ptr)pVar54.second._M_node);
        lVar45 = lVar45 + 0x20;
        lVar34 = lVar34 + -1;
      } while (lVar34 != 0);
    }
    if (local_1b8.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b8.
        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_370._0_8_ = local_370 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_370,local_260.first._M_dataplus._M_p,
                 local_260.first._M_dataplus._M_p + local_260.first._M_string_length);
      std::__cxx11::string::append(local_370);
      uVar31 = local_350->fileNums;
      local_350->fileNums = uVar31 + 1;
      uVar48 = -uVar31;
      if (0 < (int)uVar31) {
        uVar48 = uVar31;
      }
      uVar49 = 1;
      if (9 < uVar48) {
        uVar29 = (ulong)uVar48;
        uVar32 = 4;
        do {
          uVar49 = uVar32;
          uVar26 = (uint)uVar29;
          if (uVar26 < 100) {
            uVar49 = uVar49 - 2;
            goto LAB_00105f1f;
          }
          if (uVar26 < 1000) {
            uVar49 = uVar49 - 1;
            goto LAB_00105f1f;
          }
          if (uVar26 < 10000) goto LAB_00105f1f;
          uVar29 = uVar29 / 10000;
          uVar32 = uVar49 + 4;
        } while (99999 < uVar26);
        uVar49 = uVar49 + 1;
      }
LAB_00105f1f:
      local_218 = local_208;
      std::__cxx11::string::_M_construct
                ((ulong)&local_218,(char)uVar49 - (char)((int)uVar31 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar31 >> 0x1f) + (long)local_218),uVar49,uVar48);
      ppVar40 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_370._8_8_)->_M_dataplus)._M_p + local_210);
      ppVar41 = (pointer)0xf;
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)local_370._0_8_ !=
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)(local_370 + 0x10)) {
        ppVar41 = (pointer)local_370._16_8_;
      }
      if (ppVar41 < ppVar40) {
        ppVar41 = (pointer)0xf;
        if (local_218 != local_208) {
          ppVar41 = local_208[0];
        }
        if (ppVar41 < ppVar40) goto LAB_00105fa5;
        plVar23 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_218,0,(char *)0x0,local_370._0_8_);
      }
      else {
LAB_00105fa5:
        plVar23 = (long *)std::__cxx11::string::_M_append(local_370,(ulong)local_218);
      }
      local_338._0_8_ = local_328;
      ppVar40 = (pointer)(plVar23 + 2);
      if ((pointer)*plVar23 == ppVar40) {
        local_328._0_8_ = (ppVar40->first)._M_dataplus._M_p;
        local_328._8_8_ = plVar23[3];
      }
      else {
        local_328._0_8_ = (ppVar40->first)._M_dataplus._M_p;
        local_338._0_8_ = (pointer)*plVar23;
      }
      local_338._8_8_ = plVar23[1];
      *plVar23 = (long)ppVar40;
      plVar23[1] = 0;
      *(undefined1 *)&(ppVar40->first)._M_dataplus._M_p = 0;
      plVar23 = (long *)std::__cxx11::string::append(local_338);
      local_2f0._0_8_ = local_2e0;
      psVar28 = (string *)(plVar23 + 2);
      if ((string *)*plVar23 == psVar28) {
        local_2e0[0]._M_dataplus._M_p = (psVar28->_M_dataplus)._M_p;
        local_2e0[0]._M_string_length = plVar23[3];
      }
      else {
        local_2e0[0]._M_dataplus._M_p = (psVar28->_M_dataplus)._M_p;
        local_2f0._0_8_ = (string *)*plVar23;
      }
      local_2f0._8_8_ = plVar23[1];
      *plVar23 = (long)psVar28;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((pointer)local_338._0_8_ != (pointer)local_328) {
        operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
      }
      if (local_218 != local_208) {
        operator_delete(local_218,(ulong)((long)&(local_208[0]->first)._M_dataplus._M_p + 1));
      }
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)local_370._0_8_ !=
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
           *)(local_370 + 0x10)) {
        operator_delete((void *)local_370._0_8_,
                        (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_370._16_8_)->_M_dataplus)._M_p + 1));
      }
      SSTable::toSSTable((SSTable *)&local_1b8,(SSTableDic *)local_2f0,local_348,(uint64_t)psVar28);
      pSVar24 = (SSTableCache *)operator_new(0x2858);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_2f0._0_8_,
                 (pointer)(local_2f0._0_8_ + (long)(unsigned_long *)local_2f0._8_8_));
      SSTableCache::SSTableCache(pSVar24,&local_1b8,(uint64_t)local_348,&local_d0);
      local_338._0_8_ = pSVar24;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
      ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                  *)&local_350->cache,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                 (SSTableCache **)local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((string *)local_2f0._0_8_ != local_2e0) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2e0[0]._M_dataplus._M_p + 1));
      }
    }
    compaction(local_350,local_33c);
    std::
    vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1b8);
    std::
    vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_168);
    if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.first._M_dataplus._M_p != &local_260.first.field_2) {
      operator_delete(local_260.first._M_dataplus._M_p,
                      (ulong)(local_260.first.field_2._M_allocated_capacity + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
LAB_00106231:
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  return;
}

Assistant:

void KVStore::compaction(int level) {
  string dir = storagePath + "/level-" + to_string(level);

  if (!utils::dirExists(dir)) return;

  vector<string> dirFiles;
  int maxFileNum = pow2(level + 1), fileNum = utils::scanDir(dir, dirFiles);
  if (fileNum <= maxFileNum) return;

  for (string &name : dirFiles) name.insert(0, dir + '/');

  // get the files which need compaction
  vector<string> compactionFiles;
  if (level == 0) {
    compactionFiles = dirFiles;
  } else {
    // find the files with smallest timeStamp
    using nameHeader = pair<string, SSTableHeader>;
    auto cmp = [](const nameHeader &left, const nameHeader &right) {
      const auto &lHeader = left.second;
      const auto &rHeader = right.second;
      return (lHeader.timeStamp > rHeader.timeStamp ||
              (lHeader.timeStamp == rHeader.timeStamp &&
               lHeader.minKey > rHeader.minKey));
    };
    priority_queue<nameHeader, vector<nameHeader>, decltype(cmp)> q(cmp);
    int k = fileNum - maxFileNum;
    for (const auto &file : dirFiles)
      q.emplace(file, cache.at(file)->getHeader());
    while (k--) {
      auto top = q.top();
      q.pop();
      compactionFiles.push_back(top.first);
    }
  }

  // prepare minKey, maxKey, maxTimeStamp for overlap detection
  uint64_t minKey = UINT64_MAX, maxKey = 0, maxTimeStamp = 0;
  for (const auto &file : compactionFiles) {
    const auto &header = cache.at(file)->getHeader();
    maxKey = max(header.maxKey, maxKey);
    minKey = min(header.minKey, minKey);
    maxTimeStamp = max(header.timeStamp, maxTimeStamp);
  }

  // get SSTables in next level whose keys intersects with compaction Files
  string nextDir = storagePath + "/level-" + to_string(level + 1);
  if (!utils::dirExists(nextDir)) utils::mkdir(nextDir.c_str());
  dirFiles.clear();
  utils::scanDir(nextDir, dirFiles);
  for (string &name : dirFiles) name.insert(0, nextDir + '/');
  for (const auto &file : dirFiles) {
    const auto &header = cache.at(file)->getHeader();
    if ((minKey <= header.minKey && header.minKey <= maxKey) ||
        (minKey <= header.maxKey && header.maxKey <= maxKey)) {
      compactionFiles.push_back(file);
      maxTimeStamp = max(maxTimeStamp, header.timeStamp);
    }
  }

  const auto k = compactionFiles.size();
  unsigned long pairNum = 0;

  // check if it is the last level
  bool lastLevel = false;
  if (!utils::dirExists(storagePath + "/level-" + to_string(level + 2)))
    lastLevel = true;

  // read dictionaries from dics
  vector<SSTableDic> dics(compactionFiles.size());
  for (uint64_t i = 0; i < k; i++) {
    // read dic
    SSTable::readDic(compactionFiles[i], dics[i]);
    utils::rmfile(compactionFiles[i].c_str());
    pairNum += dics[i].size();
  }

  // merge the dics, convert to SSTables
  vector<uint64_t> indices(k);
  SSTableDic mergedDic;
  uint64_t lastTimeStamp = 0;
  while (pairNum--) {
    // find the next pair to merge
    minKey = UINT64_MAX;
    auto minDic = 0;
    for (uint64_t i = 0; i < k; i++) {
      if (indices[i] < dics[i].size() &&
          dics[i].at(indices[i]).first < minKey) {
        minKey = dics[i].at(indices[i]).first;
        minDic = i;
      }
    }
    const auto &pair = dics[minDic].at(indices[minDic]++);

    const auto &header = cache.at(compactionFiles[minDic])->getHeader();

    // duplicate keys, select the one with the largest timeStamp
    if (!mergedDic.empty() && pair.first == mergedDic.back().first) {
      if (header.timeStamp < lastTimeStamp)
        continue;
      else
        mergedDic.pop_back();
    }

    mergedDic.emplace_back(pair.first, pair.second);
    lastTimeStamp = header.timeStamp;
  }

  // split to SSTable
  SSTableDic t;  // TODO: can be optimized out
  uint64_t valueSize = 0, length = 0;
  for (const auto &pair : mergedDic) {
    // last level should not contain deleted value
    if (lastLevel && pair.second == "~DELETED~") continue;

    if (overflow(length + 1, valueSize + pair.second.size())) {
      auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
      SSTable::toSSTable(t, fileName, maxTimeStamp);
      cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
      valueSize = 0;
      length = 0;
      t.clear();
    }

    length++;
    valueSize += pair.second.size();
    t.push_back(pair);
  }

  // delete cache
  for (uint64_t i = 0; i < k; i++) {
    // delete cache
    assert(cache.count(compactionFiles[i]));
    auto c = cache.at(compactionFiles[i]);
    delete c;
    cache.erase(compactionFiles[i]);
  }

  // convert the remaining key value pairs to a SSTable
  if (!t.empty()) {
    auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(t, fileName, maxTimeStamp);
    cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
  }

  // compact next level
  compaction(level + 1);
}